

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pAVar4;
  long lVar5;
  pointer pAVar6;
  pointer __s;
  iterator __result;
  iterator in_RSI;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Arg *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  pointer __first;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_stack_ffffffffffffffb8;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *)0x49e736);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pAVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pAVar4;
  pAVar6 = (pointer)operator_new(0x49e798);
  __s = pAVar6 + lVar5 / 0x28;
  __first = __s;
  memset(__s,0,0x28);
  ast::SystemTimingCheckSymbol::Arg::Arg((Arg *)0x49e7d0);
  pAVar4 = end(in_RDI);
  if (in_RSI == pAVar4) {
    __result = begin(in_RDI);
    pAVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::SystemTimingCheckSymbol::Arg*,slang::ast::SystemTimingCheckSymbol::Arg*>
              (__first,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::SystemTimingCheckSymbol::Arg*,slang::ast::SystemTimingCheckSymbol::Arg*>
              (__first,__last,in_stack_ffffffffffffffa0);
    pAVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::SystemTimingCheckSymbol::Arg*,slang::ast::SystemTimingCheckSymbol::Arg*>
              (__first,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pAVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pAVar6;
  return __s;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}